

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall GlobOpt::TailDupPass(GlobOpt *this)

{
  Loop *pLVar1;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  BasicBlock *pBVar3;
  Type pSVar4;
  BranchInstr *tailBranch;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  BasicBlock *pBVar8;
  Type *ppFVar9;
  long lVar10;
  Func **ppFVar11;
  Loop *this_00;
  Iterator local_40;
  
  this_00 = this->func->m_fg->loopList;
  if (this_00 != (Loop *)0x0) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pLVar1 = this_00->next;
      pBVar8 = Loop::GetHeadBlock(this_00);
      local_40.list =
           &(pBVar8->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
      local_40.current = &(local_40.list)->super_SListNodeBase<Memory::ArenaAllocator>;
      do {
        if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
            (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar6) goto LAB_004382d4;
          *puVar7 = 0;
        }
        pSVar2 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                 (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  &(local_40.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if (pSVar2 == local_40.list) goto LAB_004382b8;
        local_40.current = (NodeBase *)pSVar2;
        ppFVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            (&local_40);
        pBVar8 = (*ppFVar9)->predBlock;
        if (pBVar8 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x2da,"(pred)","pred");
          if (!bVar6) goto LAB_004382d4;
          *puVar7 = 0;
        }
        bVar6 = Loop::IsDescendentOrSelf(this_00,pBVar8->loop);
      } while (!bVar6);
      pBVar3 = pBVar8->next;
      ppFVar11 = (Func **)&pBVar3->firstInstr;
      if (pBVar3 == (BasicBlock *)0x0) {
        ppFVar11 = &pBVar8->func;
      }
      lVar10 = 0x18;
      if (pBVar3 == (BasicBlock *)0x0) {
        lVar10 = 0xd0;
      }
      if (*(char *)(*(long *)((long)&(*ppFVar11)->m_alloc + lVar10) + 0x39) != '\x02') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x2e5,"(loopTail->GetLastInstr()->IsBranchInstr())",
                           "LastInstr of loop should always be a branch no?");
        if (!bVar6) goto LAB_004382d4;
        *puVar7 = 0;
      }
      pSVar4 = (pBVar8->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
               super_SListNodeBase<Memory::ArenaAllocator>.next;
      if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar4 == &pBVar8->predList) ||
         ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar4->next != &pBVar8->predList)
         ) {
        pBVar3 = pBVar8->next;
        ppFVar11 = (Func **)&pBVar3->firstInstr;
        if (pBVar3 == (BasicBlock *)0x0) {
          ppFVar11 = &pBVar8->func;
        }
        lVar10 = 0x18;
        if (pBVar3 == (BasicBlock *)0x0) {
          lVar10 = 0xd0;
        }
        tailBranch = *(BranchInstr **)((long)&(*ppFVar11)->m_alloc + lVar10);
        if ((tailBranch->super_Instr).m_kind != InstrKindBranch) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
          if (!bVar6) {
LAB_004382d4:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar7 = 0;
        }
        TryTailDup(this,tailBranch);
      }
LAB_004382b8:
      this_00 = pLVar1;
    } while (pLVar1 != (Loop *)0x0);
  }
  return;
}

Assistant:

void
GlobOpt::TailDupPass()
{
    FOREACH_LOOP_IN_FUNC_EDITING(loop, this->func)
    {
        BasicBlock* header = loop->GetHeadBlock();
        BasicBlock* loopTail = nullptr;
        FOREACH_PREDECESSOR_BLOCK(pred, header)
        {
            if (loop->IsDescendentOrSelf(pred->loop))
            {
                loopTail = pred;
                break;
            }
        } NEXT_PREDECESSOR_BLOCK;

        if (loopTail)
        {
            AssertMsg(loopTail->GetLastInstr()->IsBranchInstr(), "LastInstr of loop should always be a branch no?");

            if (!loopTail->GetPredList()->HasOne())
            {
                TryTailDup(loopTail->GetLastInstr()->AsBranchInstr());
            }
        }
    } NEXT_LOOP_IN_FUNC_EDITING;
}